

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderPerformanceMeasurer::ShaderPerformanceMeasurer
          (ShaderPerformanceMeasurer *this,RenderContext *renderCtx,PerfCaseType measureType)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = 0xff;
  if (measureType == CASETYPE_FRAGMENT) {
    iVar1 = 1;
  }
  this->m_renderCtx = renderCtx;
  this->m_gridSizeX = iVar1;
  this->m_gridSizeY = iVar1;
  if (measureType == CASETYPE_VERTEX) {
    this->m_viewportWidth = 0x20;
    iVar1 = 0x20;
  }
  else {
    iVar1 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
    this->m_viewportWidth = *(int *)CONCAT44(extraout_var,iVar1);
    iVar1 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
    iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 4);
  }
  this->m_viewportHeight = iVar1;
  this->m_state = STATE_UNINITIALIZED;
  (this->m_result).megaVertPerSec = -1.0;
  (this->m_result).megaFragPerSec = -1.0;
  TheilSenCalibrator::TheilSenCalibrator(&this->m_calibrator);
  this->m_indexBuffer = 0;
  (this->m_attributes).
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attributes).
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_attributes).
  super__Vector_base<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_vao = 0;
  return;
}

Assistant:

ShaderPerformanceMeasurer::ShaderPerformanceMeasurer (const glu::RenderContext& renderCtx, PerfCaseType measureType)
	: m_renderCtx		(renderCtx)
	, m_gridSizeX		(measureType == CASETYPE_FRAGMENT	? 1		: 255)
	, m_gridSizeY		(measureType == CASETYPE_FRAGMENT	? 1		: 255)
	, m_viewportWidth	(measureType == CASETYPE_VERTEX		? 32	: renderCtx.getRenderTarget().getWidth())
	, m_viewportHeight	(measureType == CASETYPE_VERTEX		? 32	: renderCtx.getRenderTarget().getHeight())
	, m_state			(STATE_UNINITIALIZED)
	, m_result			(-1.0f, -1.0f)
	, m_indexBuffer		(0)
	, m_vao				(0)
{
}